

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::ZSobolSampler::Get1D(ZSobolSampler *this)

{
  CranleyPattersonRotator randomizer;
  uint64_t a;
  uint64_t uVar1;
  float fVar2;
  
  a = GetSampleIndex(this);
  uVar1 = MixBits((long)(this->seed ^ this->dimension));
  this->dimension = this->dimension + 1;
  randomizer.delta = (uint32_t)uVar1;
  switch(this->randomizeStrategy) {
  case None:
    fVar2 = SobolSampleFloat<pbrt::NoRandomizer>(a,0);
    return fVar2;
  case CranleyPatterson:
    fVar2 = SobolSampleFloat<pbrt::CranleyPattersonRotator>(a,0,randomizer);
    return fVar2;
  case PermuteDigits:
    fVar2 = SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                      (a,0,(BinaryPermuteScrambler)randomizer.delta);
    return fVar2;
  case FastOwen:
    fVar2 = SobolSampleFloat<pbrt::FastOwenScrambler>(a,0,(FastOwenScrambler)randomizer.delta);
    return fVar2;
  default:
    fVar2 = SobolSampleFloat<pbrt::OwenScrambler>(a,0,(OwenScrambler)randomizer.delta);
    return fVar2;
  }
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        uint64_t sampleIndex = GetSampleIndex();
        uint32_t sampleHash = MixBits(dimension ^ seed);

        ++dimension;

        if (randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sampleIndex, 0, NoRandomizer());
        else if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return SobolSample(sampleIndex, 0, CranleyPattersonRotator(sampleHash));
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return SobolSample(sampleIndex, 0, BinaryPermuteScrambler(sampleHash));
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return SobolSample(sampleIndex, 0, FastOwenScrambler(sampleHash));
        else
            return SobolSample(sampleIndex, 0, OwenScrambler(sampleHash));
    }